

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.hpp
# Opt level: O2

__pid_t __thiscall ycqian::barrier::wait(barrier *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> uStack_18;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_18,&this->mutex);
  if (this->current == 1) {
    this->current = this->count;
    std::condition_variable::notify_all();
  }
  else {
    this->current = this->current - 1;
    std::condition_variable::wait((unique_lock *)&this->cv);
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_18);
  return extraout_EAX;
}

Assistant:

void wait(){
            std::unique_lock<std::mutex> lk(mutex);
            if (current == 1) {
                current = count;//reset
                cv.notify_all();
            } else {
                current--;
                cv.wait(lk);
            }
        }